

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  mapped_type *pmVar3;
  cmLinkInterface *pcVar4;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dummy;
  string prop;
  key_type local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  key_type local_1a8 [11];
  
  this_00 = target->Makefile;
  local_1b0 = missingTargets;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != SHARED_LIBRARY) {
    TVar2 = cmGeneratorTarget::GetType(target);
    if (TVar2 != MODULE_LIBRARY) goto LAB_003715df;
  }
  bVar1 = cmGeneratorTarget::IsDLLPlatform(target);
  if (!bVar1) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    bVar1 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_1e8,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator *)&local_1c8);
      bVar1 = cmMakefile::IsOn(this_00,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (bVar1) {
        (*this->_vptr_cmExportFileGenerator[0x12])(&local_1e8,this,target,config);
        std::__cxx11::string::operator=((string *)&local_208,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::string::assign((char *)local_1a8);
      cmGeneratorTarget::GetSOName(&local_1e8,target,config);
      std::__cxx11::string::append((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      std::__cxx11::string::assign((char *)local_1a8);
      std::__cxx11::string::assign((char *)&local_208);
    }
    std::__cxx11::string::append((string *)local_1a8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)local_1a8);
  }
LAB_003715df:
  pcVar4 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (pcVar4 != (cmLinkInterface *)0x0) {
    std::__cxx11::string::string
              ((string *)local_1a8,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator *)&local_208);
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,local_1a8,&pcVar4->Languages,properties,local_1b0);
    std::__cxx11::string::~string((string *)local_1a8);
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string
              ((string *)local_1a8,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator *)&local_208);
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,local_1a8,&pcVar4->SharedDeps,properties,&local_1c8);
    std::__cxx11::string::~string((string *)local_1a8);
    if (pcVar4->Multiplicity != 0) {
      std::__cxx11::string::string
                ((string *)&local_208,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",(allocator *)local_1a8)
      ;
      std::__cxx11::string::append((string *)&local_208);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_208);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LANGUAGES",
                                iface->Languages, properties, missingTargets);

    std::vector<std::string> dummy;
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_DEPENDENT_LIBRARIES",
                                iface->SharedDeps, properties, dummy);
    if (iface->Multiplicity > 0) {
      std::string prop = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
      prop += suffix;
      std::ostringstream m;
      m << iface->Multiplicity;
      properties[prop] = m.str();
    }
  }
}